

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aabb.cpp
# Opt level: O0

bool __thiscall AABB::Intersect(AABB *this,Ray *ray,float t_min,float t_max)

{
  float *pfVar1;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  float _t_max;
  float _t_min;
  float _inv_d;
  int i;
  Ray *in_stack_ffffffffffffff18;
  Vec3 local_7c;
  Vec3 local_70;
  float local_64;
  Vec3 local_60;
  Vec3 local_54;
  float local_48 [5];
  Vec3 local_34;
  float local_28;
  int local_24;
  float local_20;
  float local_1c [7];
  
  local_24 = 0;
  local_20 = in_XMM1_Da;
  local_1c[0] = in_XMM0_Da;
  while( true ) {
    if (2 < local_24) {
      return true;
    }
    Ray::GetDirection(in_stack_ffffffffffffff18);
    pfVar1 = Vec3::operator[](&local_34,local_24);
    fVar2 = *pfVar1;
    Vec3::~Vec3(&local_34);
    local_28 = 1.0 / fVar2;
    GetMin((AABB *)in_stack_ffffffffffffff18);
    pfVar1 = Vec3::operator[](&local_54,local_24);
    fVar2 = *pfVar1;
    Ray::GetOrigin(in_stack_ffffffffffffff18);
    pfVar1 = Vec3::operator[](&local_60,local_24);
    fVar2 = (fVar2 - *pfVar1) * local_28;
    Vec3::~Vec3(&local_60);
    Vec3::~Vec3(&local_54);
    local_48[0] = fVar2;
    GetMax((AABB *)in_stack_ffffffffffffff18);
    pfVar1 = Vec3::operator[](&local_70,local_24);
    fVar2 = *pfVar1;
    Ray::GetOrigin(in_stack_ffffffffffffff18);
    pfVar1 = Vec3::operator[](&local_7c,local_24);
    fVar2 = (fVar2 - *pfVar1) * local_28;
    Vec3::~Vec3(&local_7c);
    Vec3::~Vec3(&local_70);
    local_64 = fVar2;
    if (local_28 < 0.0) {
      std::swap<float>(local_48,&local_64);
    }
    pfVar1 = std::max<float>(local_48,local_1c);
    local_1c[0] = *pfVar1;
    pfVar1 = std::min<float>(&local_64,&local_20);
    local_20 = *pfVar1;
    if (local_20 <= local_1c[0]) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool
AABB::Intersect(const Ray& ray, float t_min, float t_max) const
{

// for all axis (x,y,z)
    for(int i=0; i<3; ++i) {
        
// compute t0,t1 overlap intervals
        float _inv_d = 1.0f / ray.GetDirection()[i];
        float _t_min = (GetMin()[i] - ray.GetOrigin()[i]) * _inv_d;
        float _t_max = (GetMax()[i] - ray.GetOrigin()[i]) * _inv_d;
        
        if(_inv_d < 0.0f) {
            std::swap(_t_min, _t_max);
        }

        t_min = std::max(_t_min, t_min);
        t_max = std::min(_t_max, t_max);

// no collision in this axis
        if(t_max <= t_min) {
            return false;
        }
    }

// we have overlap on all axes
    return true;
}